

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939acd.c
# Opt level: O1

int repeat_address(int sock,uint64_t name)

{
  ssize_t sVar1;
  int *piVar2;
  uint8_t dat [8];
  uint64_t local_10;
  
  local_10 = name;
  if (s.verbose != 0) {
    fprintf(_stderr,"- send(, %ld, 8, 0);\n",name);
  }
  sVar1 = sendto(sock,&local_10,8,0,(sockaddr *)&repeat_address::saddr,0x18);
  if ((int)sVar1 < 0) {
    piVar2 = __errno_location();
    if ((*piVar2 != 4) && (*piVar2 != 0x69)) {
      repeat_address_cold_1();
    }
  }
  return (int)sVar1;
}

Assistant:

static int repeat_address(int sock, uint64_t name)
{
	int ret;
	uint8_t dat[8];
	static const struct sockaddr_can saddr = {
		.can_family = AF_CAN,
		.can_addr.j1939 = {
			.pgn = J1939_PGN_ADDRESS_CLAIMED,
			.addr = J1939_NO_ADDR,
		},
	};

	memcpy(dat, &name, 8);
	if (!host_is_little_endian())
		bswap(dat, 8);
	if (s.verbose)
		fprintf(stderr, "- send(, %" PRId64 ", 8, 0);\n", name);
	ret = sendto(sock, dat, sizeof(dat), 0, (const struct sockaddr *)&saddr,
		     sizeof(saddr));
	if (must_warn(ret))
		fprintf(stderr, "send address claim for 0x%02x\n", s.last_sa);
	return ret;
}